

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,LIBSSH2_SFTP_ATTRIBUTES *attrs,int setstat)

{
  LIBSSH2_SFTP *sftp;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  ssize_t sVar6;
  ulong uVar7;
  char *errmsg;
  ulong uVar8;
  bool bVar9;
  uchar *s;
  size_t data_len;
  size_t in_stack_ffffffffffffff78;
  char *local_78;
  byte *local_70;
  LIBSSH2_SFTP_ATTRIBUTES *local_68;
  uchar *local_60;
  int local_54;
  char *local_50;
  LIBSSH2_SFTP_HANDLE *local_48;
  char *local_40;
  time_t local_38;
  
  iVar3 = -0x27;
  if (attrs != (LIBSSH2_SFTP_ATTRIBUTES *)0x0 && hnd != (LIBSSH2_SFTP_HANDLE *)0x0) {
    local_68 = attrs;
    local_38 = time((time_t *)0x0);
    bVar9 = setstat != 0;
    local_50 = "Unable to send FXP_FSETSTAT";
    if (!bVar9) {
      local_50 = "Unable to send FXP_FSTAT command";
    }
    local_40 = hnd->handle;
    local_54 = setstat;
    local_48 = hnd;
    do {
      sftp = hnd->sftp;
      channel = sftp->channel;
      pLVar1 = channel->session;
      local_60 = (uchar *)0x0;
      if (setstat == 0) {
        lVar5 = 0;
      }
      else {
        uVar2 = (uint)local_68->flags;
        lVar5 = (ulong)(uVar2 & 0xc) + (ulong)(uVar2 & 1) * 8 + (ulong)(uVar2 & 2) * 4 + 4;
      }
      uVar8 = hnd->handle_len + 0xd + lVar5;
      local_78 = (char *)0x0;
      if (sftp->fstat_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        local_70 = (byte *)(*pLVar1->alloc)(uVar8 & 0xffffffff,&pLVar1->abstract);
        sftp->fstat_packet = local_70;
        if (local_70 != (byte *)0x0) {
          _libssh2_store_u32(&local_70,(int)uVar8 - 4);
          *local_70 = bVar9 * '\x02' | 8;
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->fstat_request_id = uVar4;
          local_70 = local_70 + 1;
          _libssh2_store_u32(&local_70,uVar4);
          setstat = local_54;
          _libssh2_store_str(&local_70,local_40,hnd->handle_len);
          if (setstat != 0) {
            sVar6 = sftp_attr2bin(local_70,local_68);
            local_70 = local_70 + sVar6;
          }
          sftp->fstat_state = libssh2_NB_state_created;
          hnd = local_48;
          goto LAB_00126e01;
        }
        iVar3 = -6;
        errmsg = "Unable to allocate memory for FSTAT/FSETSTAT packet";
        local_70 = (byte *)0x0;
        goto LAB_00126f56;
      }
LAB_00126e01:
      if (sftp->fstat_state == libssh2_NB_state_created) {
        uVar7 = _libssh2_channel_write(channel,0,sftp->fstat_packet,uVar8 & 0xffffffff);
        iVar3 = -0x25;
        if (uVar7 != 0xffffffffffffffdb) {
          (*pLVar1->free)(sftp->fstat_packet,&pLVar1->abstract);
          sftp->fstat_packet = (uchar *)0x0;
          if ((uVar8 & 0xffffffff) != uVar7) {
            sftp->fstat_state = libssh2_NB_state_idle;
            iVar3 = -7;
            errmsg = local_50;
            goto LAB_00126f56;
          }
          sftp->fstat_state = libssh2_NB_state_sent;
          goto LAB_00126e5f;
        }
      }
      else {
LAB_00126e5f:
        iVar3 = sftp_packet_requirev
                          (sftp,0x1346af,(uchar *)(ulong)sftp->fstat_request_id,(uint32_t)&local_78,
                           &local_60,(size_t *)0x9,in_stack_ffffffffffffff78);
        if (iVar3 == 0) {
          sftp->fstat_state = libssh2_NB_state_idle;
          if (*local_78 == 'e') {
            uVar4 = _libssh2_ntohu32((uchar *)(local_78 + 5));
            (*pLVar1->free)(local_78,&pLVar1->abstract);
            if (uVar4 == 0) {
LAB_00126faf:
              iVar3 = 0;
              goto LAB_00126f5b;
            }
            sftp->last_errno = uVar4;
            iVar3 = -0x1f;
            errmsg = "SFTP Protocol Error";
          }
          else {
            sVar6 = sftp_bin2attr(local_68,(uchar *)(local_78 + 5),(size_t)(local_60 + -5));
            (*pLVar1->free)(local_78,&pLVar1->abstract);
            if (-1 < sVar6) goto LAB_00126faf;
            iVar3 = -0x1f;
            errmsg = "Attributes too short in SFTP fstat";
          }
LAB_00126f56:
          iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
        }
        else if (iVar3 != -0x25) {
          if (iVar3 == -0x26) {
            if (local_60 != (uchar *)0x0) {
              (*pLVar1->free)(local_78,&pLVar1->abstract);
            }
            iVar3 = -0x1f;
            errmsg = "SFTP fstat packet too short";
          }
          else {
            sftp->fstat_state = libssh2_NB_state_idle;
            errmsg = "Timeout waiting for status message";
          }
          goto LAB_00126f56;
        }
      }
LAB_00126f5b:
      if (iVar3 != -0x25) {
        return iVar3;
      }
      pLVar1 = hnd->sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar3 = _libssh2_wait_socket(pLVar1,local_38);
    } while (iVar3 == 0);
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fstat_ex(LIBSSH2_SFTP_HANDLE *hnd,
                      LIBSSH2_SFTP_ATTRIBUTES *attrs, int setstat)
{
    int rc;
    if(!hnd || !attrs)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_fstat(hnd, attrs, setstat));
    return rc;
}